

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

int __thiscall cfd::core::OutPoint::Compare(OutPoint *this,OutPoint *object)

{
  _Alloc_hider __s1;
  int iVar1;
  string local_58;
  string local_38;
  
  iVar1 = 1;
  if ((object->vout_ <= this->vout_) && (iVar1 = -1, this->vout_ <= object->vout_)) {
    Txid::GetHex_abi_cxx11_(&local_58,&this->txid_);
    __s1._M_p = local_58._M_dataplus._M_p;
    Txid::GetHex_abi_cxx11_(&local_38,&object->txid_);
    iVar1 = strncmp(__s1._M_p,local_38._M_dataplus._M_p,0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return iVar1;
}

Assistant:

int OutPoint::Compare(const OutPoint &object) const {
  if (vout_ < object.vout_)
    return 1;
  else if (vout_ > object.vout_)
    return -1;
  return std::strncmp(
      txid_.GetHex().c_str(), object.txid_.GetHex().c_str(),
      kByteData256Length * 2);
}